

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O3

wchar_t borg_attack_aux_wand_bolt
                  (wchar_t sval,wchar_t rad,wchar_t dam,wchar_t typ,wchar_t selection)

{
  uint32_t uVar1;
  wchar_t wVar2;
  char *what;
  wchar_t wVar3;
  
  wVar2 = L'\0';
  wVar3 = L'\0';
  if ((((borg.trait[0x70] == 0) && (wVar3 = wVar2, borg.trait[0x72] == 0)) &&
      (borg.trait[0x78] == 0)) && (borg.trait[0x69] != 0)) {
    if ((borg_simulate) && (uVar1 = Rand_div(100), (int)uVar1 < 2)) {
      return L'\0';
    }
    wVar2 = borg_slot(L'\x17',sval);
    if (((L'\xffffffff' < wVar2) && (borg_items[(uint)wVar2].pval != 0)) &&
       (wVar2 = borg_activate_failure(L'\x17',sval), wVar2 < L'ǵ')) {
      wVar2 = borg_launch_bolt(rad,dam,typ,(uint)z_info->max_range,L'\0');
      wVar3 = wVar2 + L'\xfffffffb';
      if (borg.trait[0x23] < 6) {
        wVar3 = wVar2;
      }
      if ((sv_wand_wonder == sval) && (borg.munchkin_mode == false)) {
        if (wVar3 < L'\x01') {
          wVar3 = L'\0';
        }
        else {
          wVar3 = L'\0';
          wVar2 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
          if ((avoidance * 7) / 10 <= wVar2) {
            what = format("# Emergency use of a Wand of Wonder.");
            borg_note(what);
            wVar3 = L'ϧ';
          }
        }
      }
      if (borg_simulate == false) {
        borg_aim_wand(sval);
        borg_keypress(0x35);
        successful_target = L'\xffffffff';
      }
    }
  }
  return wVar3;
}

Assistant:

static int borg_attack_aux_wand_bolt(
    int sval, int rad, int dam, int typ, int selection)
{
    int i;

    int b_n;

    /* No firing while blind, confused, or hallucinating */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE])
        return 0;

    /* Dont use wands in town, charges are too spendy */
    if (!borg.trait[BI_CDEPTH])
        return 0;

    /* Paranoia */
    if (borg_simulate && (randint0(100) < 2))
        return 0;

    /* Look for that wand */
    i = borg_slot(TV_WAND, sval);

    /* None available */
    if (i < 0)
        return 0;

    /* No charges */
    if (!borg_items[i].pval)
        return 0;

    /* Not likely to be successful in the activation */
    if (500 < borg_activate_failure(TV_WAND, sval))
        return 0;

    /* Choose optimal location */
    b_n = borg_launch_bolt(rad, dam, typ, z_info->max_range, 0);

    /* Penalize charge usage */
    if (borg.trait[BI_CLEVEL] > 5)
        b_n = b_n - 5;

    /* Wands of wonder are used in last ditch efforts.  They behave
     * randomly, so the best use of them is an emergency.  I have seen
     * borgs die from hill orcs with fully charged wonder wands.  Odds
     * are he could have taken the orcs with the wand.  So use them in
     * an emergency after all the borg_caution() steps have failed
     */
    if (sval == sv_wand_wonder && !borg.munchkin_mode) {
        /* check the danger */
        if (b_n > 0
            && borg_danger(borg.c.y, borg.c.x, 1, true, false)
                   >= (avoidance * 7 / 10)) {
            /* make the wand appear deadly */
            b_n = 999;

            /* note the use of the wand in the emergency */
            borg_note(format("# Emergency use of a Wand of Wonder."));
        } else {
            b_n = 0;
        }
    }

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Aim the wand */
    (void)borg_aim_wand(sval);

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -1;

    /*  select the correct effect */
    if (selection != -1)
        borg_keypress('b' + selection);

    /* Value */
    return b_n;
}